

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O3

timeval google::protobuf::util::TimeUtil::DurationToTimeval(Duration *value)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  timeval tVar5;
  
  iVar2 = value->nanos_;
  uVar3 = (ulong)(0 < iVar2 % 1000 && iVar2 < -999);
  lVar1 = uVar3 + (long)(iVar2 / 1000);
  tVar5.tv_sec = (lVar1 >> 0x3f) + value->seconds_;
  lVar4 = uVar3 + 1000000 + (long)(iVar2 / 1000);
  if (-1 < lVar1) {
    lVar4 = lVar1;
  }
  tVar5.tv_usec = lVar4;
  return tVar5;
}

Assistant:

timeval TimeUtil::DurationToTimeval(const Duration& value) {
  timeval result;
  result.tv_sec = value.seconds();
  result.tv_usec = RoundTowardZero(value.nanos(), kNanosPerMicrosecond);
  // timeval.tv_usec's range is [0, 1000000)
  if (result.tv_usec < 0) {
    result.tv_sec -= 1;
    result.tv_usec += kMicrosPerSecond;
  }
  return result;
}